

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O0

uint32_t * FastPForLib::__fastunpack25_8(uint32_t *in,uint32_t *out)

{
  uint *puVar1;
  uint *puVar2;
  uint32_t *out_local;
  uint32_t *in_local;
  
  *out = *in & 0x1ffffff;
  puVar1 = out + 1;
  *puVar1 = *in >> 0x19;
  *puVar1 = (in[1] & 0x3ffff) << 7 | *puVar1;
  puVar1 = out + 2;
  *puVar1 = in[1] >> 0x12;
  *puVar1 = (in[2] & 0x7ff) << 0xe | *puVar1;
  puVar1 = out + 3;
  *puVar1 = in[2] >> 0xb;
  puVar2 = in + 3;
  *puVar1 = (*puVar2 & 0xf) << 0x15 | *puVar1;
  out[4] = *puVar2 >> 4 & 0x1ffffff;
  puVar1 = out + 5;
  *puVar1 = *puVar2 >> 0x1d;
  *puVar1 = (in[4] & 0x3fffff) << 3 | *puVar1;
  puVar1 = out + 6;
  *puVar1 = in[4] >> 0x16;
  *puVar1 = (in[5] & 0x7fff) << 10 | *puVar1;
  puVar1 = out + 7;
  *puVar1 = in[5] >> 0xf;
  *puVar1 = (in[6] & 0xff) << 0x11 | *puVar1;
  return in + 7;
}

Assistant:

const uint32_t *__fastunpack25_8(const uint32_t *__restrict__ in,
                                 uint32_t *__restrict__ out) {

  *out = ((*in) >> 0) % (1U << 25);
  out++;
  *out = ((*in) >> 25);
  ++in;
  *out |= ((*in) % (1U << 18)) << (25 - 18);
  out++;
  *out = ((*in) >> 18);
  ++in;
  *out |= ((*in) % (1U << 11)) << (25 - 11);
  out++;
  *out = ((*in) >> 11);
  ++in;
  *out |= ((*in) % (1U << 4)) << (25 - 4);
  out++;
  *out = ((*in) >> 4) % (1U << 25);
  out++;
  *out = ((*in) >> 29);
  ++in;
  *out |= ((*in) % (1U << 22)) << (25 - 22);
  out++;
  *out = ((*in) >> 22);
  ++in;
  *out |= ((*in) % (1U << 15)) << (25 - 15);
  out++;
  *out = ((*in) >> 15);
  ++in;
  *out |= ((*in) % (1U << 8)) << (25 - 8);
  out++;

  return in + 1;
}